

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<kj::StringPtr_&> __thiscall
kj::Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::BadHasher>>::
find<0ul,char_const(&)[7]>
          (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::BadHasher>> *this,
          char (*params) [7])

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  size_t __n;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  long lVar7;
  char *in_RDX;
  ulong uVar8;
  ulong uVar9;
  ulong unaff_RBP;
  int *piVar10;
  
  lVar2 = *(long *)params;
  uVar3 = *(ulong *)(params + 8);
  if (uVar3 != 0) {
    uVar8 = (ulong)((int)uVar3 - 1U & 0x4d2);
    lVar7 = *(long *)(params[6] + 6);
    uVar1 = *(uint *)(lVar7 + 4 + uVar8 * 8);
    unaff_RBP = (ulong)uVar1;
    if (uVar1 != 0) {
      piVar10 = (int *)(lVar7 + uVar8 * 8);
      sVar6 = strlen(in_RDX);
      do {
        if (((int)unaff_RBP != 1) && (*piVar10 == 0x4d2)) {
          unaff_RBP = (ulong)((int)unaff_RBP - 2);
          __n = *(size_t *)(lVar2 + 8 + unaff_RBP * 0x10);
          if ((__n == sVar6 + 1) &&
             ((bVar4 = true, __n == 0 ||
              (iVar5 = bcmp(*(void **)(lVar2 + unaff_RBP * 0x10),in_RDX,__n), iVar5 == 0)))) break;
        }
        uVar9 = uVar8 + 1;
        bVar4 = false;
        uVar8 = 0;
        if (uVar9 != uVar3) {
          uVar8 = uVar9 & 0xffffffff;
        }
        piVar10 = (int *)(lVar7 + uVar8 * 8);
        unaff_RBP = (ulong)(uint)piVar10[1];
      } while (piVar10[1] != 0);
      goto LAB_0015cdd4;
    }
  }
  bVar4 = false;
LAB_0015cdd4:
  lVar7 = 0;
  if (bVar4) {
    lVar7 = lVar2 + unaff_RBP * 0x10;
  }
  *(long *)this = lVar7;
  return (Maybe<kj::StringPtr_&>)(StringPtr *)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}